

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageDataOperator::process
          (MessageDataOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  bool bVar1;
  long in_RSI;
  __uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true> in_RDI;
  SmallBuffer *in_stack_ffffffffffffffb8;
  function<void_(helics::SmallBuffer_&)> *in_stack_ffffffffffffffc0;
  
  bVar1 = std::function::operator_cast_to_bool((function<void_(helics::SmallBuffer_&)> *)0x3a4988);
  if (bVar1) {
    in_stack_ffffffffffffffc0 = (function<void_(helics::SmallBuffer_&)> *)(in_RSI + 8);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x3a49a6);
    std::function<void_(helics::SmallBuffer_&)>::operator()
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             in_stack_ffffffffffffffc0,
             (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
             in_stack_ffffffffffffffb8);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         in_RDI.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
         super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Message> MessageDataOperator::process(std::unique_ptr<Message> message)
{
    if (dataFunction) {
        dataFunction(message->data);
    }
    return message;
}